

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Expression * __thiscall soul::StructuralParser::parseTernaryOperator(StructuralParser *this)

{
  char *__s1;
  int iVar1;
  Expression *args_1;
  Expression *args_2;
  Expression *args_3;
  TernaryOp *pTVar2;
  Context context;
  Context local_30;
  
  args_1 = parseLogicalOr(this);
  __s1 = (this->super_SOULTokeniser).currentType.text;
  if (__s1 != "?") {
    if (__s1 == (char *)0x0) {
      return args_1;
    }
    iVar1 = strcmp(__s1,"?");
    if (iVar1 != 0) {
      return args_1;
    }
  }
  local_30.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_30.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_30.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_30.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_30.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_30.parentScope = this->currentScope;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::skip(&this->super_SOULTokeniser);
  args_2 = parseTernaryOperator(this);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x262bf0);
  args_3 = parseTernaryOperator(this);
  pTVar2 = PoolAllocator::
           allocate<soul::AST::TernaryOp,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&,soul::AST::Expression&>
                     (&this->allocator->pool,&local_30,args_1,args_2,args_3);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_30.location.sourceCode.object);
  return &pTVar2->super_Expression;
}

Assistant:

AST::Expression& parseTernaryOperator()
    {
        auto& a = parseLogicalOr();

        if (! matches (Operator::question))
            return a;

        auto context = getContext();
        skip();
        auto& trueBranch = parseTernaryOperator();
        expect (Operator::colon);
        auto& falseBranch = parseTernaryOperator();
        return allocate<AST::TernaryOp> (context, a, trueBranch, falseBranch);
    }